

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::~TransferTestInstance
          (TransferTestInstance *this)

{
  (this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TransferTestInstance_00bcc928;
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_msImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_depthImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_dstImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_srcImageAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_dstBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniqueBase
            (&(this->m_srcBufferAlloc).
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::~RefBase
            (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  TimestampTestInstance::~TimestampTestInstance(&this->super_TimestampTestInstance);
  return;
}

Assistant:

TransferTestInstance::~TransferTestInstance(void)
{
}